

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O2

long __thiscall
gl4cts::anon_unknown_0::AdvancedLargeStrideAndOffsetsNewAndLegacyAPI::Setup
          (AdvancedLargeStrideAndOffsetsNewAndLegacyAPI *this)

{
  CallLogWrapper *this_00;
  
  this->m_vsp = 0;
  this_00 = &(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glGenProgramPipelines(this_00,1,&this->m_ppo);
  glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_ssbo);
  glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->m_vao);
  glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_vbo);
  return 0;
}

Assistant:

virtual long Setup()
	{
		m_vsp = 0;
		glGenProgramPipelines(1, &m_ppo);
		glGenBuffers(1, &m_ssbo);
		glGenVertexArrays(1, &m_vao);
		glGenBuffers(1, &m_vbo);
		return NO_ERROR;
	}